

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Matrix4f.cpp
# Opt level: O2

Matrix4f *
Matrix4f::orthographicProjection
          (Matrix4f *__return_storage_ptr__,float left,float right,float bottom,float top,
          float zNear,float zFar,bool directX)

{
  undefined8 uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined4 in_XMM0_Db;
  undefined4 in_XMM0_Dc;
  undefined4 in_XMM0_Dd;
  undefined4 in_XMM1_Db;
  undefined4 in_XMM1_Dc;
  undefined4 in_XMM1_Dd;
  undefined4 in_XMM2_Db;
  undefined4 in_XMM2_Dc;
  undefined4 in_XMM2_Dd;
  undefined4 in_XMM3_Db;
  undefined4 in_XMM3_Dc;
  undefined4 in_XMM3_Dd;
  undefined1 auVar6 [16];
  
  Matrix4f(__return_storage_ptr__,0.0);
  auVar2._4_4_ = in_XMM1_Db;
  auVar2._0_4_ = right;
  auVar2._8_4_ = in_XMM1_Dc;
  auVar2._12_4_ = in_XMM1_Dd;
  auVar3._4_4_ = in_XMM0_Db;
  auVar3._0_4_ = left;
  auVar3._8_4_ = in_XMM0_Dc;
  auVar3._12_4_ = in_XMM0_Dd;
  auVar5._4_4_ = in_XMM3_Db;
  auVar5._0_4_ = top;
  auVar5._8_4_ = in_XMM3_Dc;
  auVar5._12_4_ = in_XMM3_Dd;
  auVar4._4_4_ = in_XMM2_Db;
  auVar4._0_4_ = bottom;
  auVar4._8_4_ = in_XMM2_Dc;
  auVar4._12_4_ = in_XMM2_Dd;
  __return_storage_ptr__->m_elements[0] = 2.0 / (right - left);
  auVar2 = vinsertps_avx(auVar2,auVar5,0x10);
  __return_storage_ptr__->m_elements[5] = 2.0 / (top - bottom);
  auVar3 = vinsertps_avx(auVar3,auVar4,0x10);
  __return_storage_ptr__->m_elements[0xf] = 1.0;
  auVar6._0_4_ = auVar3._0_4_ + auVar2._0_4_;
  auVar6._4_4_ = auVar3._4_4_ + auVar2._4_4_;
  auVar6._8_4_ = auVar3._8_4_ + auVar2._8_4_;
  auVar6._12_4_ = auVar3._12_4_ + auVar2._12_4_;
  auVar2 = vsubps_avx(auVar3,auVar2);
  auVar2 = vdivps_avx(auVar6,auVar2);
  uVar1 = vmovlps_avx(auVar2);
  *(undefined8 *)(__return_storage_ptr__->m_elements + 0xc) = uVar1;
  __return_storage_ptr__->m_elements[10] =
       (float)((uint)directX * 0x3f800000 + (uint)!directX * 0x40000000) / (zNear - zFar);
  __return_storage_ptr__->m_elements[0xe] =
       (float)((uint)directX * (int)zNear + (uint)!directX * (int)(zNear + zFar)) / (zNear - zFar);
  return __return_storage_ptr__;
}

Assistant:

Matrix4f Matrix4f::orthographicProjection( float left, float right, float bottom, float top, float zNear, float zFar, bool directX )
{
	Matrix4f m;

	m( 0, 0 ) = 2.0f / ( right - left );
	m( 1, 1 ) = 2.0f / ( top - bottom );
	m( 3, 3 ) = 1.0f;

	m( 0, 3 ) = ( left + right ) / ( left - right );
	m( 1, 3 ) = ( top + bottom ) / ( bottom - top );

	if( directX )
	{
		m( 2, 2 ) = 1.0f / ( zNear - zFar );
		m( 2, 3 ) = zNear / ( zNear - zFar );
	}
	else
	{
		m( 2, 2 ) = 2.0f / ( zNear - zFar );
		m( 2, 3 ) = ( zNear + zFar ) / ( zNear - zFar );
	}

	return m;
}